

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw_gl3.cpp
# Opt level: O3

void ImGui_ImplGlfwGL3_InvalidateDeviceObjects(void)

{
  ImGuiIO *pIVar1;
  
  if (g_VaoHandle != 0) {
    (*gl3wDeleteVertexArrays)(1,&g_VaoHandle);
  }
  if (g_VboHandle != 0) {
    (*gl3wDeleteBuffers)(1,&g_VboHandle);
  }
  if (g_ElementsHandle != 0) {
    (*gl3wDeleteBuffers)(1,&g_ElementsHandle);
  }
  g_ElementsHandle = 0;
  g_VboHandle = 0;
  g_VaoHandle = 0;
  (*gl3wDetachShader)(g_ShaderHandle,g_VertHandle);
  (*gl3wDeleteShader)(g_VertHandle);
  g_VertHandle = 0;
  (*gl3wDetachShader)(g_ShaderHandle,g_FragHandle);
  (*gl3wDeleteShader)(g_FragHandle);
  g_FragHandle = 0;
  (*gl3wDeleteProgram)(g_ShaderHandle);
  g_ShaderHandle = 0;
  if (g_FontTexture != 0) {
    (*gl3wDeleteTextures)(1,&g_FontTexture);
    pIVar1 = ImGui::GetIO();
    pIVar1->Fonts->TexID = (void *)0x0;
    g_FontTexture = 0;
  }
  return;
}

Assistant:

void    ImGui_ImplGlfwGL3_InvalidateDeviceObjects()
{
    if (g_VaoHandle) glDeleteVertexArrays(1, &g_VaoHandle);
    if (g_VboHandle) glDeleteBuffers(1, &g_VboHandle);
    if (g_ElementsHandle) glDeleteBuffers(1, &g_ElementsHandle);
    g_VaoHandle = g_VboHandle = g_ElementsHandle = 0;

    glDetachShader(g_ShaderHandle, g_VertHandle);
    glDeleteShader(g_VertHandle);
    g_VertHandle = 0;

    glDetachShader(g_ShaderHandle, g_FragHandle);
    glDeleteShader(g_FragHandle);
    g_FragHandle = 0;

    glDeleteProgram(g_ShaderHandle);
    g_ShaderHandle = 0;

    if (g_FontTexture)
    {
        glDeleteTextures(1, &g_FontTexture);
        ImGui::GetIO().Fonts->TexID = 0;
        g_FontTexture = 0;
    }
}